

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void precomp_wnaf(pt_prj_t_conflict4 *precomp,pt_aff_t_conflict4 *P)

{
  int i;
  pt_aff_t_conflict4 *in_stack_00000028;
  pt_prj_t_conflict4 *in_stack_00000030;
  pt_prj_t_conflict4 *in_stack_00000168;
  pt_prj_t_conflict4 *in_stack_00000170;
  pt_prj_t_conflict4 *in_stack_00000190;
  pt_prj_t_conflict4 *in_stack_00000198;
  pt_prj_t_conflict4 *in_stack_000001a0;
  undefined4 local_14;
  
  point_legacy2edwards(in_stack_00000030,in_stack_00000028);
  point_double(in_stack_00000170,in_stack_00000168);
  for (local_14 = 1; local_14 < 0x10; local_14 = local_14 + 1) {
    point_add_proj(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  return;
}

Assistant:

static void precomp_wnaf(pt_prj_t precomp[DRADIX / 2], const pt_aff_t *P) {
    int i;

    fe_copy(precomp[0].X, P->X);
    fe_copy(precomp[0].Y, P->Y);
    fe_copy(precomp[0].Z, const_one);
    point_double(&precomp[DRADIX / 2 - 1], &precomp[0]);

    for (i = 1; i < DRADIX / 2; i++)
        point_add_proj(&precomp[i], &precomp[DRADIX / 2 - 1], &precomp[i - 1]);
}